

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagecontrol.cpp
# Opt level: O2

void __thiscall QtMWidgets::PageControl::paintEvent(PageControl *this,QPaintEvent *param_1)

{
  int iVar1;
  PageControlPrivate *pPVar2;
  reference pQVar3;
  ulong i;
  QPoint local_38;
  QPainter p;
  
  QPainter::QPainter(&p,(QPaintDevice *)&this->field_0x10);
  QPainter::setRenderHint((RenderHint)&p,true);
  QPainter::setPen((QColor *)&p);
  for (i = 0; pPVar2 = (this->d).d, (long)i < (long)pPVar2->count; i = i + 1) {
    if (i == (uint)pPVar2->currentIndex) {
      QBrush::QBrush((QBrush *)&local_38,&pPVar2->currentPageIndicatorColor,SolidPattern);
      QPainter::setBrush((QBrush *)&p);
      QBrush::~QBrush((QBrush *)&local_38);
      pQVar3 = QList<QRect>::operator[](&((this->d).d)->rectangles,i);
      local_38 = QRect::center(pQVar3);
      iVar1 = ((this->d).d)->radius;
      QPainter::drawEllipse(&p,&local_38,iVar1,iVar1);
    }
    else {
      QBrush::QBrush((QBrush *)&local_38,&pPVar2->pageIndicatorColor,SolidPattern);
      QPainter::setBrush((QBrush *)&p);
      QBrush::~QBrush((QBrush *)&local_38);
      pQVar3 = QList<QRect>::operator[](&((this->d).d)->rectangles,i);
      local_38 = QRect::center(pQVar3);
      iVar1 = ((this->d).d)->smallRadius;
      QPainter::drawEllipse(&p,&local_38,iVar1,iVar1);
    }
  }
  QPainter::~QPainter(&p);
  return;
}

Assistant:

void
PageControl::paintEvent( QPaintEvent * )
{
	QPainter p( this );
	p.setRenderHint( QPainter::Antialiasing );
	p.setPen( d->pageIndicatorColor );

	for( int i = 0; i < d->count; ++i )
	{
		if( i == d->currentIndex )
		{
			p.setBrush( d->currentPageIndicatorColor );

			p.drawEllipse( d->rectangles[ i ].center(), d->radius, d->radius );
		}
		else
		{
			p.setBrush( d->pageIndicatorColor );

			p.drawEllipse( d->rectangles[ i ].center(),
				d->smallRadius, d->smallRadius );
		}
	}
}